

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall
slang::parsing::Parser::scanQualifiedName(Parser *this,uint32_t *index,bool allowNew)

{
  bool bVar1;
  byte in_DL;
  int *in_RSI;
  Token TVar2;
  Token next;
  uint32_t offset;
  Token in_stack_ffffffffffffff90;
  ParserBase *this_00;
  TokenKind local_60;
  TokenKind local_40;
  TokenKind local_30;
  
  TVar2 = ParserBase::peek((ParserBase *)in_stack_ffffffffffffff90.info,
                           in_stack_ffffffffffffff90.rawLen);
  local_30 = TVar2.kind;
  if (local_30 == Identifier) goto LAB_002c4ce2;
  if (local_30 == UnitSystemName) goto LAB_002c4ce2;
  do {
    if (((in_DL & 1) == 0) || (local_30 != NewKeyword)) {
      return false;
    }
LAB_002c4ce2:
    do {
      *in_RSI = *in_RSI + 1;
      this_00 = (ParserBase *)in_stack_ffffffffffffff90.info;
      offset = in_stack_ffffffffffffff90.rawLen;
      TVar2 = ParserBase::peek(this_00,offset);
      local_40 = TVar2.kind;
      if (local_40 == Hash) {
        *in_RSI = *in_RSI + 1;
        TVar2 = ParserBase::peek(this_00,offset);
        if (TVar2.kind != OpenParenthesis) {
          return false;
        }
        *in_RSI = *in_RSI + 1;
        bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>
                          ((Parser *)TVar2.info,TVar2._0_8_,local_60._14_2_,local_60._12_2_);
        if (!bVar1) {
          return false;
        }
      }
      _local_60 = ParserBase::peek(this_00,offset);
      if (local_60 != DoubleColon) {
        return true;
      }
      *in_RSI = *in_RSI + 1;
      in_stack_ffffffffffffff90 = ParserBase::peek(this_00,offset);
      local_30 = in_stack_ffffffffffffff90.kind;
    } while (local_30 == Identifier);
  } while( true );
}

Assistant:

bool Parser::scanQualifiedName(uint32_t& index, bool allowNew) {
    auto next = peek(index);
    if (next.kind != TokenKind::Identifier && next.kind != TokenKind::UnitSystemName &&
        (!allowNew || next.kind != TokenKind::NewKeyword)) {
        return false;
    }

    while (true) {
        if (peek(++index).kind == TokenKind::Hash) {
            // scan parameter value assignment
            if (peek(++index).kind != TokenKind::OpenParenthesis)
                return false;

            index++;
            if (!scanTypePart<isNotInType>(index, TokenKind::OpenParenthesis,
                                           TokenKind::CloseParenthesis)) {
                return false;
            }
        }

        if (peek(index).kind != TokenKind::DoubleColon)
            break;

        next = peek(++index);
        if (next.kind != TokenKind::Identifier && (!allowNew || next.kind != TokenKind::NewKeyword))
            return false;
    }
    return true;
}